

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::Expression,duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long&>
          (duckdb *this,LogicalType *args,unsigned_long *args_1)

{
  BoundReferenceExpression *this_00;
  LogicalType LStack_38;
  
  this_00 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType(&LStack_38,args);
  BoundReferenceExpression::BoundReferenceExpression(this_00,&LStack_38,*args_1);
  *(BoundReferenceExpression **)this = this_00;
  LogicalType::~LogicalType(&LStack_38);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}